

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manager.h
# Opt level: O1

void __thiscall Manager::Manager(Manager *this,int bRow,int bColumn,int Games)

{
  undefined8 *puVar1;
  pointer pBVar2;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  Board local_98;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_58;
  int local_34;
  
  (this->puzzles).super__Vector_base<Board,_std::allocator<Board>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->puzzles).super__Vector_base<Board,_std::allocator<Board>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->puzzles).super__Vector_base<Board,_std::allocator<Board>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_34 = bColumn;
  std::vector<Board,_std::allocator<Board>_>::resize(&this->puzzles,(long)Games);
  if ((this->puzzles).super__Vector_base<Board,_std::allocator<Board>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->puzzles).super__Vector_base<Board,_std::allocator<Board>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar6 = 0x30;
    uVar5 = 0;
    do {
      Board::Board(&local_98,bRow,local_34);
      pBVar2 = (this->puzzles).super__Vector_base<Board,_std::allocator<Board>_>._M_impl.
               super__Vector_impl_data._M_start;
      pvVar3 = *(void **)((long)pBVar2 + lVar6 + -0x30);
      *(pointer *)((long)pBVar2 + lVar6 + -0x30) =
           local_98.armada.super__Vector_base<Ship,_std::allocator<Ship>_>._M_impl.
           super__Vector_impl_data._M_start;
      *(pointer *)((long)pBVar2 + lVar6 + -0x28) =
           local_98.armada.super__Vector_base<Ship,_std::allocator<Ship>_>._M_impl.
           super__Vector_impl_data._M_finish;
      *(pointer *)((long)pBVar2 + lVar6 + -0x20) =
           local_98.armada.super__Vector_base<Ship,_std::allocator<Ship>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_98.armada.super__Vector_base<Ship,_std::allocator<Ship>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.armada.super__Vector_base<Ship,_std::allocator<Ship>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.armada.super__Vector_base<Ship,_std::allocator<Ship>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3);
      }
      *(undefined8 *)((long)pBVar2 + lVar6 + -0x18) = local_98._24_8_;
      local_58.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = *(pointer *)((long)pBVar2 + lVar6 + -0x10);
      puVar1 = (undefined8 *)((long)pBVar2 + lVar6 + -8);
      local_58.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)*puVar1;
      local_58.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)puVar1[1];
      *(pointer *)((long)pBVar2 + lVar6 + -0x10) =
           local_98.matrix.
           super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)((long)pBVar2 + lVar6 + -8) =
           local_98.matrix.
           super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      *(pointer *)((long)&(pBVar2->armada).super__Vector_base<Ship,_std::allocator<Ship>_> + lVar6)
           = local_98.matrix.
             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_98.matrix.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.matrix.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.matrix.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector(&local_58);
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector(&local_98.matrix);
      if (local_98.armada.super__Vector_base<Ship,_std::allocator<Ship>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.armada.super__Vector_base<Ship,_std::allocator<Ship>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      uVar5 = uVar5 + 1;
      uVar4 = ((long)(this->puzzles).super__Vector_base<Board,_std::allocator<Board>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->puzzles).super__Vector_base<Board,_std::allocator<Board>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
      lVar6 = lVar6 + 0x38;
    } while (uVar5 <= uVar4 && uVar4 - uVar5 != 0);
  }
  return;
}

Assistant:

Manager( int bRow, int bColumn, int Games )
        {

            // "allocating" the vector of vectors using the method resize()
            puzzles.resize( Games );

           for( int i = 0; i < puzzles.size(); i++ )
           {
              puzzles[i] = Board( bRow, bColumn );
           }

        }